

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Remove(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  int selector;
  PClassActor *filter_00;
  VMValue *pVVar1;
  AActor *pAVar2;
  bool bVar3;
  bool local_5f;
  FName local_5c;
  AActor *local_58;
  AActor *reference;
  PClassActor *pPStack_48;
  FName species;
  MetaClass *filter;
  int flags;
  int removee;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b6,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b6,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  local_5f = true;
  if (pAVar2 != (AActor *)0x0) {
    local_5f = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
  }
  if (local_5f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b6,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b7,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x18b7,
                  "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  selector = param[1].field_0.i;
  if (numparam < 3) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b8,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    filter._0_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b8,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    filter._0_4_ = param[2].field_0.i;
  }
  if (numparam < 4) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    bVar3 = false;
    if ((pVVar1->field_0).field_3.Type == '\x03') {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      bVar3 = true;
      if ((pVVar1->field_0).field_1.atag != 1) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        bVar3 = (pVVar1->field_0).field_1.a == (void *)0x0;
      }
    }
    if (!bVar3) {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b9,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    pPStack_48 = (PClassActor *)(pVVar1->field_0).field_1.a;
  }
  else {
    bVar3 = false;
    if ((param[3].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[3].field_0.field_1.atag != 1)) {
      bVar3 = param[3].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18b9,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pPStack_48 = (PClassActor *)param[3].field_0.field_1.a;
  }
  FName::FName((FName *)((long)&reference + 4));
  if (numparam < 5) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18ba,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    FName::operator=((FName *)((long)&reference + 4),(pVVar1->field_0).i);
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x18ba,
                    "int AF_AActor_A_Remove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    FName::operator=((FName *)((long)&reference + 4),param[4].field_0.i);
  }
  pAVar2 = COPY_AAPTR(pAVar2,selector);
  filter_00 = pPStack_48;
  if (pAVar2 != (AActor *)0x0) {
    local_58 = pAVar2;
    FName::FName(&local_5c,(FName *)((long)&reference + 4));
    DoRemove(pAVar2,(int)filter,filter_00,&local_5c);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Remove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(removee);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	AActor *reference = COPY_AAPTR(self, removee);
	if (reference != NULL)
	{
		DoRemove(reference, flags, filter, species);
	}
	return 0;
}